

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_display_options.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  ALLEGRO_DISPLAY *display;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  ALLEGRO_DISPLAY *pAVar8;
  char **ppcVar9;
  int i;
  ulong uVar10;
  int iVar11;
  int *piVar12;
  char *format;
  int iVar13;
  bool bVar14;
  undefined4 uVar15;
  float fVar16;
  ALLEGRO_DISPLAY_MODE mode;
  ALLEGRO_EVENT event;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    ppcVar9 = flag_names;
    piVar12 = &DAT_00104040;
    for (uVar10 = 0; uVar10 != 0x20; uVar10 = uVar10 + 1) {
      if ((uVar10 < 0xb) && ((0x677U >> ((uint)uVar10 & 0x1f) & 1) != 0)) {
        *ppcVar9 = (char *)((long)&DAT_00104040 + (long)*piVar12);
      }
      piVar12 = piVar12 + 1;
      ppcVar9 = ppcVar9 + 1;
    }
    al_init_primitives_addon();
    uVar15 = 0x3f800000;
    fVar16 = 0.0;
    uVar4 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    white.b = (float)uVar15;
    white.r = (float)(int)uVar4;
    white.g = (float)(int)((ulong)uVar4 >> 0x20);
    white.a = fVar16;
    al_install_keyboard();
    al_install_mouse();
    al_init_font_addon();
    display = (ALLEGRO_DISPLAY *)al_create_display(800,600);
    if (display != (ALLEGRO_DISPLAY *)0x0) {
      load_font();
      uVar4 = al_create_timer(0x11111111);
      modes_count = al_get_num_display_modes();
      options_count = 0x18;
      update_ui();
      al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
      al_clear_to_color();
      display_options(display);
      al_flip_display();
      uVar5 = al_create_event_queue();
      uVar6 = al_get_keyboard_event_source();
      al_register_event_source(uVar5,uVar6);
      uVar6 = al_get_mouse_event_source();
      al_register_event_source(uVar5,uVar6);
      uVar6 = al_get_display_event_source(display);
      al_register_event_source(uVar5,uVar6);
      uVar6 = al_get_timer_event_source(uVar4);
      al_register_event_source(uVar5,uVar6);
      al_start_timer(uVar4);
LAB_00102672:
      do {
        bVar14 = false;
        do {
          al_wait_for_event(uVar5,&event);
          if (event.type == 0x2a) {
LAB_00102a1c:
            al_destroy_font(font);
            return 0;
          }
          if ((event.type == 0x15) && (event.mouse.button == 1)) {
            iVar2 = al_get_display_width(display);
            iVar11 = (event.display.height + -10) / font_h;
            iVar13 = iVar11 + -1;
            iVar2 = event.display.width / (iVar2 / 2);
            if ((iVar2 == 0) && ((0 < iVar11 && (iVar13 <= modes_count)))) {
              selected_column = 0;
              bVar14 = true;
              selected_mode = iVar13;
            }
            if (((iVar2 == 1) && (0 < iVar11)) && (iVar11 <= options_count)) {
              selected_column = 1;
              bVar14 = true;
              selected_option = iVar13;
            }
          }
          if ((event.type == 0x1e) && (uVar3 = al_get_display_flags(display), uVar3 != flags)) {
            old_flags = old_flags | uVar3;
            bVar14 = true;
            flags = uVar3;
          }
          if (event.type != 0xb) goto LAB_00102854;
          switch(event.display.width) {
          case 0x52:
            selected_column = 0;
            goto LAB_001027ec;
          case 0x53:
            selected_column = 1;
LAB_001027ec:
            bVar14 = true;
            break;
          case 0x54:
            bVar14 = true;
            if (selected_column == 1) {
              selected_option = selected_option + -1;
            }
            else if (selected_column == 0) {
              selected_mode = selected_mode + -1;
            }
            break;
          case 0x55:
            bVar14 = true;
            if (selected_column == 1) {
              selected_option = selected_option + 1;
            }
            else if (selected_column == 0) {
              selected_mode = selected_mode + 1;
            }
            break;
          default:
            if (event.display.width == 0x43) {
              if (selected_column == 0) {
                if (selected_mode < 2) {
                  mode.width = 800;
                  mode.height = 600;
                  uVar4 = 1;
                  if (selected_mode == 1) {
                    uVar4 = 0x200;
                  }
                }
                else {
                  al_get_display_mode(selected_mode + -2,&mode);
                  uVar4 = 2;
                }
                al_set_new_display_flags(uVar4);
                al_destroy_font(font);
                font = (ALLEGRO_FONT *)0x0;
                pAVar8 = (ALLEGRO_DISPLAY *)al_create_display(mode._0_8_ & 0xffffffff,mode.height);
                if (pAVar8 == (ALLEGRO_DISPLAY *)0x0) {
                  builtin_strncpy(status + 0x10," failed.",9);
                }
                else {
                  al_destroy_display(display);
                  al_set_target_backbuffer(pAVar8);
                  uVar4 = al_get_display_event_source(pAVar8);
                  al_register_event_source(uVar5,uVar4);
                  update_ui();
                  builtin_strncpy(status + 0x10," succeeded.",0xc);
                  display = pAVar8;
                }
                builtin_strncpy(status,"Display creation",0x10);
                load_font();
              }
              bVar14 = true;
              if (selected_column == 1) {
                lVar7 = (long)selected_option;
                options[lVar7].required = (options[lVar7].required + 1) % 3;
                al_set_new_display_option(options[lVar7].option,options[lVar7].value);
              }
            }
            else if (event.display.width == 0x3b) goto LAB_00102a1c;
          }
          if (((event.display.width & 0xfffffffeU) == 0x50) && (selected_column == 1)) {
            uVar3 = (uint)(event.display.width == 0x50);
            if (event.display.width == 0x51) {
              uVar3 = 0xffffffff;
            }
            lVar7 = (long)selected_option;
            iVar11 = uVar3 + options[lVar7].value;
            if (iVar11 < 1) {
              iVar11 = 0;
            }
            options[lVar7].value = iVar11;
            iVar2 = options[lVar7].max_value;
            if (iVar2 < iVar11) {
              options[lVar7].value = iVar2;
              iVar11 = iVar2;
            }
            al_set_new_display_option(options[lVar7].option,iVar11,options[lVar7].required);
            bVar14 = true;
          }
LAB_00102854:
          if (selected_mode < 0) {
            selected_mode = 0;
          }
          if (modes_count + 1 < selected_mode) {
            selected_mode = modes_count + 1;
          }
          if (selected_option < 0) {
            selected_option = 0;
          }
          if (options_count <= selected_option) {
            selected_option = options_count + -1;
          }
          if (selected_mode < first_visible_row) {
            first_visible_row = selected_mode;
          }
          if (first_visible_row + visible_rows <= selected_mode) {
            first_visible_row = (selected_mode - visible_rows) + 1;
          }
          if (!bVar14) goto LAB_00102672;
          cVar1 = al_is_event_queue_empty(uVar5);
          bVar14 = true;
        } while (cVar1 == '\0');
        al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
        al_clear_to_color();
        display_options(display);
        al_flip_display();
      } while( true );
    }
    format = "Could not create display.\n";
  }
  abort_example(format);
  font = (ALLEGRO_FONT *)al_create_builtin_font();
  if (font == (ALLEGRO_FONT *)0x0) {
    abort_example("Error creating builtin font\n");
    uVar4 = al_get_current_display();
    iVar11 = al_get_display_height(uVar4);
    visible_rows = iVar11 / font_h + -10;
    return extraout_EAX_00;
  }
  font_h = al_get_font_line_height(font);
  return extraout_EAX;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_TIMER *timer;
   bool redraw = false;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   init_flags();
   al_init_primitives_addon();
   
   white = al_map_rgba_f(1, 1, 1, 1);

   al_install_keyboard();
   al_install_mouse();
   al_init_font_addon();

   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Could not create display.\n");
   }

   load_font();

   timer = al_create_timer(1.0 / 60);

   modes_count = al_get_num_display_modes();
   options_count = sizeof(options) / sizeof(options[0]);
   
   update_ui();
   
   al_clear_to_color(al_map_rgb_f(1, 1, 1));
   display_options(display);
   al_flip_display();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1) {
            int dw = al_get_display_width(display);
            int y = 10;
            int row = (event.mouse.y - y) / font_h - 1;
            int column = event.mouse.x / (dw / 2);
            if (column == 0) {
               if (row >= 0 && row <= modes_count) {
                  selected_column = column;
                  selected_mode = row;
                  redraw = true;
               }
            }
            if (column == 1) {
               if (row >= 0 && row < options_count) {
                  selected_column = column;
                  selected_option = row;
                  redraw = true;
               }
            }
         }
      }
      if (event.type == ALLEGRO_EVENT_TIMER) {
          int f = al_get_display_flags(display);
          if (f != flags) {
              redraw = true;
              flags = f;
              old_flags |= f;
          }
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         int change;
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.keycode == ALLEGRO_KEY_LEFT) {
            selected_column = 0;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_RIGHT) {
            selected_column = 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_UP) {
            if (selected_column == 0) selected_mode -= 1;
            if (selected_column == 1) selected_option -= 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_DOWN) {
            if (selected_column == 0) selected_mode += 1;
            if (selected_column == 1) selected_option += 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_ENTER) {
             if (selected_column == 0) {
                ALLEGRO_DISPLAY_MODE mode;
                ALLEGRO_DISPLAY *new_display;
                if (selected_mode > 1) {
                    al_get_display_mode(selected_mode - 2, &mode);
                    al_set_new_display_flags(ALLEGRO_FULLSCREEN);
                }
                else if (selected_mode == 1) {
                    mode.width = 800;
                    mode.height = 600;
                    al_set_new_display_flags(ALLEGRO_FULLSCREEN_WINDOW);
                }
                else {
                    mode.width = 800;
                    mode.height = 600;
                    al_set_new_display_flags(ALLEGRO_WINDOWED);
                }

                al_destroy_font(font);
                font = NULL;

                new_display = al_create_display(
                   mode.width, mode.height);
                if (new_display) {
                   al_destroy_display(display);
                   display = new_display;
                   al_set_target_backbuffer(display);
                   al_register_event_source(queue,
                      al_get_display_event_source(display));
                   update_ui();
                   sprintf(status, "Display creation succeeded.");
                }
                else {
                   sprintf(status, "Display creation failed.");
                }

                load_font();
             }
             if (selected_column == 1) {
                 options[selected_option].required += 1;
                 options[selected_option].required %= 3;
                 al_set_new_display_option(
                    options[selected_option].option,
                    options[selected_option].value,
                    options[selected_option].required);
             }
             redraw = true;
         }
         change = 0;
         if (event.keyboard.keycode == ALLEGRO_KEY_PGUP) change = 1;
         if (event.keyboard.keycode == ALLEGRO_KEY_PGDN) change = -1;
         if (change && selected_column == 1) {
            options[selected_option].value += change;
            if (options[selected_option].value < 0)
               options[selected_option].value = 0;
            if (options[selected_option].value >
               options[selected_option].max_value)
               options[selected_option].value =
                  options[selected_option].max_value;
            al_set_new_display_option(options[selected_option].option,
               options[selected_option].value,
               options[selected_option].required);
            redraw = true;
         }
      }
      
      if (selected_mode < 0) selected_mode = 0;
      if (selected_mode > modes_count + 1)
         selected_mode = modes_count + 1;
      if (selected_option < 0) selected_option = 0;
      if (selected_option >= options_count)
         selected_option = options_count - 1;
      if (selected_mode < first_visible_row)
         first_visible_row = selected_mode;
      if (selected_mode > first_visible_row + visible_rows - 1)
         first_visible_row = selected_mode - visible_rows + 1;

      if (redraw && al_is_event_queue_empty(queue)) {
         redraw = false;
         al_clear_to_color(al_map_rgb_f(1, 1, 1));
         display_options(display);
         al_flip_display();
      }
   }

   al_destroy_font(font);

   return 0;
}